

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genCompareLessThan(InstructionGenerator *this)

{
  allocator local_c9;
  string local_c8 [32];
  Variable local_a8;
  Variable local_78;
  Variable local_48;
  int local_18;
  Instruction local_14;
  InstructionGenerator *local_10;
  InstructionGenerator *this_local;
  
  local_14 = COMPARE_LESS_THAN;
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_14);
  local_18 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
            (this->bytecode,&local_18);
  VirtualStack::pop(&local_48,&this->super_VirtualStack);
  Variable::~Variable(&local_48);
  VirtualStack::pop(&local_78,&this->super_VirtualStack);
  Variable::~Variable(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"",&local_c9);
  Variable::Variable(&local_a8,(string *)local_c8,BOOL);
  VirtualStack::push(&this->super_VirtualStack,&local_a8);
  Variable::~Variable(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

void InstructionGenerator::genCompareLessThan()
{
    bytecode->emplace_back(Instruction::COMPARE_LESS_THAN);
    bytecode->emplace_back(0);
    pop();
    pop();
    push(Variable("", DataType::BOOL));
}